

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

Torsion * __thiscall OpenMD::SelectionManager::beginUnselectedTorsion(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  Torsion *pTVar3;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  if ((**(byte **)&pOVar1[3].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) != 0) {
    iVar2 = OpenMDBitSet::nextOffBit(pOVar1 + 3,0);
  }
  *i = iVar2;
  if (iVar2 == -1) {
    pTVar3 = (Torsion *)0x0;
  }
  else {
    pTVar3 = (this->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2];
  }
  return pTVar3;
}

Assistant:

Torsion* SelectionManager::beginUnselectedTorsion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[TORSION].size())) {
      if (!ss_.bitsets_[TORSION][i]) {
        // check that this processor owns this torsion
        if (torsions_[i] != NULL) return torsions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[TORSION].firstOffBit();
    return i == -1 ? NULL : torsions_[i];
#endif
  }